

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O2

afl_child_ret __thiscall UCAFL::_handle_child_requests(UCAFL *this)

{
  afl_child_ret aVar1;
  ssize_t sVar2;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  afl_child_ret child_msg;
  uint64_t pc;
  
  while( true ) {
    sVar2 = read(this->afl_child_pipe_[0],&child_msg,4);
    aVar1 = child_msg;
    if (sVar2 != 4) {
      return AFL_CHILD_EXITED;
    }
    __x_00 = log(__x);
    if (aVar1 < AFL_CHILD_TSL_REQUEST) break;
    if (aVar1 == AFL_CHILD_TSL_REQUEST) {
      sVar2 = read(this->afl_child_pipe_[0],&pc,8);
      if (sVar2 != 8) {
        log(__x_01);
        return AFL_CHILD_EXITED;
      }
      uc_ctl(this->uc_,0xc8000008,pc,0);
      log(__x_02);
    }
    else {
      log(__x_00);
    }
  }
  return aVar1;
}

Assistant:

afl_child_ret _handle_child_requests() {
        enum afl_child_ret child_msg;

        while (1) {

            /* Broken pipe means it's time to return to the fork server routine.
             */

            if (read(_R(this->afl_child_pipe_), &child_msg,
                     sizeof(enum afl_child_ret)) != sizeof(enum afl_child_ret))
                return AFL_CHILD_EXITED; // child is dead.

            ERR("Get a child_msg=%d\n", child_msg);

            if (child_msg == AFL_CHILD_NEXT ||
                child_msg == AFL_CHILD_FOUND_CRASH) {

                // Forward if child found a crash or not, for persistent mode.
                return child_msg;

            } else if (child_msg == AFL_CHILD_TSL_REQUEST) {
                uint64_t pc;
                uc_err err;

                if (read(_R(this->afl_child_pipe_), &pc, 8) != 8) {
                    ERR("Fail to read child tsl request.\n");
                    return AFL_CHILD_EXITED; // child is dead.
                }

                err = uc_ctl_request_cache(this->uc_, pc, NULL);

                if (unlikely(err != UC_ERR_OK)) {
                    ERR("Fail to cache the TB at 0x%" PRIx64 ".\n", pc);
                } else {
                    ERR("TB is cached at 0x%" PRIx64 ".\n", pc);
                }

            } else {

                ERR("Unexpected response by child! %d. Please report this "
                    "as bug for unicornafl.\n"
                    "    Expected one of {AFL_CHILD_NEXT: %d, "
                    "AFL_CHILD_FOUND_CRASH: %d, AFL_CHILD_TSL_REQUEST: %d}.\n",
                    child_msg, AFL_CHILD_NEXT, AFL_CHILD_FOUND_CRASH,
                    AFL_CHILD_TSL_REQUEST);
            }
        }
    }